

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal.h
# Opt level: O2

Span<unsigned_char> __thiscall bssl::DTLSIncomingMessage::msg(DTLSIncomingMessage *this)

{
  Span<unsigned_char> SVar1;
  Span<unsigned_char> local_10;
  
  local_10.data_ = (this->data).data_;
  local_10.size_ = (this->data).size_;
  SVar1 = Span<unsigned_char>::subspan(&local_10,0xc,0xffffffffffffffff);
  return SVar1;
}

Assistant:

Span<uint8_t> msg() { return Span(data).subspan(DTLS1_HM_HEADER_LENGTH); }